

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::
vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
::reserve(vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
          *this,size_t n)

{
  LensElementInterface *pLVar1;
  iterator pLVar2;
  ulong in_RSI;
  vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
  *in_RDI;
  int i;
  LensElementInterface *ra;
  LensElementInterface *in_stack_ffffffffffffffc8;
  LensElementInterface *in_stack_ffffffffffffffd0;
  int local_1c;
  
  if (in_RDI->nAlloc < in_RSI) {
    pLVar1 = pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>::
             allocate_object<pbrt::RealisticCamera::LensElementInterface>
                       ((polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface> *)
                        in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8);
    for (local_1c = 0; (ulong)(long)local_1c < in_RDI->nStored; local_1c = local_1c + 1) {
      in_stack_ffffffffffffffd0 = pLVar1 + local_1c;
      pLVar2 = begin(in_RDI);
      pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>::
      construct<pbrt::RealisticCamera::LensElementInterface,pbrt::RealisticCamera::LensElementInterface>
                (&in_RDI->alloc,in_stack_ffffffffffffffd0,pLVar2 + local_1c);
      pLVar2 = begin(in_RDI);
      pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>::
      destroy<pbrt::RealisticCamera::LensElementInterface>(&in_RDI->alloc,pLVar2 + local_1c);
    }
    pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>::
    deallocate_object<pbrt::RealisticCamera::LensElementInterface>
              ((polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface> *)
               in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x73c1c4);
    in_RDI->nAlloc = in_RSI;
    in_RDI->ptr = pLVar1;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }